

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

size_t __thiscall
OpenSSLWrapper::SslConnection::SslPutInData(SslConnection *this,uint8_t *szBuffer,size_t nWriteLen)

{
  int iVar1;
  runtime_error *this_00;
  SslConnection *pSStack_40;
  int iResult;
  size_t nWritten;
  size_t local_28;
  size_t nWriteLen_local;
  uint8_t *szBuffer_local;
  SslConnection *this_local;
  
  local_28 = nWriteLen;
  nWriteLen_local = (size_t)szBuffer;
  szBuffer_local = (uint8_t *)this;
  if (this->m_ssl == (SSL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not Initialized");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->m_iWantState = this->m_iWantState & 0xfffffffe;
  pSStack_40 = (SslConnection *)0x0;
  iVar1 = BIO_write_ex(this->m_wbio,szBuffer,nWriteLen,&stack0xffffffffffffffc0);
  if (iVar1 < 1) {
    this_local = (SslConnection *)0x0;
  }
  else {
    BIO_ctrl((BIO *)this->m_wbio,0xb,0,(void *)0x0);
    this_local = pSStack_40;
  }
  return (size_t)this_local;
}

Assistant:

size_t SslConnection::SslPutInData(const uint8_t* szBuffer, size_t nWriteLen)
    {
        if (nullptr == m_ssl)
            throw runtime_error("Not Initialized");

        m_iWantState &= ~1;
        size_t nWritten = 0;
        const int iResult = BIO_write_ex(m_wbio, szBuffer, nWriteLen, &nWritten);
        if (iResult <= 0)
            return 0;
        BIO_flush(m_wbio);
        return nWritten;
    }